

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDV.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Storage::MassStorage::HDV::get_block
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,HDV *this,
          size_t address)

{
  long source_address;
  long offset;
  size_t in_RCX;
  FileHolder *this_00;
  undefined1 local_58 [48];
  
  this_00 = (FileHolder *)local_58;
  source_address = address - 0x40;
  if ((long)address < 0x40) {
    local_58._0_8_ = (FILE *)0x0;
    local_58._8_8_ = (pointer)0x0;
    local_58._16_8_ = (pointer)0x0;
    Encodings::Apple::PartitionMap<Storage::MassStorage::Encodings::AppleII::VolumeProvider>::
    convert_source_block
              (__return_storage_ptr__,&this->mapper_,source_address,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  }
  else {
    offset = offset_for_block(this,source_address);
    FileHolder::seek(&this->file_,offset,0);
    this_00 = (FileHolder *)(local_58 + 0x18);
    FileHolder::read(this_00,(int)&this->file_,(void *)0x200,in_RCX);
    Encodings::Apple::PartitionMap<Storage::MassStorage::Encodings::AppleII::VolumeProvider>::
    convert_source_block
              (__return_storage_ptr__,&this->mapper_,source_address,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> HDV::get_block(size_t address) {
	const auto source_address = mapper_.to_source_address(address);
	const auto file_offset = offset_for_block(source_address);

	if(source_address >= 0) {
		file_.seek(file_offset, SEEK_SET);
		return mapper_.convert_source_block(source_address, file_.read(get_block_size()));
	} else {
		return mapper_.convert_source_block(source_address);
	}
}